

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::setData_helper<int>
          (GLAttributeBuffer *this,vector<int,_std::allocator<int>_> *data)

{
  pointer piVar1;
  ulong uVar2;
  pointer piVar3;
  GLsizeiptr GVar4;
  ulong uVar5;
  ulong uVar6;
  
  (*glad_glBindBuffer)(0x8892,this->VBOLoc);
  piVar3 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((this->super_AttributeBuffer).setFlag == false) {
    uVar5 = (this->super_AttributeBuffer).bufferSize;
    uVar2 = (long)piVar1 - (long)piVar3 >> 2;
  }
  else {
    uVar5 = (this->super_AttributeBuffer).bufferSize;
    GVar4 = (long)piVar1 - (long)piVar3;
    uVar2 = GVar4 >> 2;
    if (uVar2 <= uVar5) goto LAB_0023d096;
  }
  (this->super_AttributeBuffer).setFlag = true;
  uVar6 = uVar5 * 2;
  if (uVar5 * 2 < uVar2) {
    uVar6 = uVar2;
  }
  (*glad_glBufferData)(0x8892,uVar6 * 4,(void *)0x0,0x88e4);
  (this->super_AttributeBuffer).bufferSize = uVar6;
  piVar3 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  GVar4 = (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  uVar2 = GVar4 >> 2;
LAB_0023d096:
  (this->super_AttributeBuffer).dataSize = uVar2;
  (*glad_glBufferSubData)(0x8892,0,GVar4,piVar3);
  checkGLError(true);
  return;
}

Assistant:

void GLAttributeBuffer::setData_helper(const std::vector<T>& data) {
  bind();

  // allocate if needed
  if (!isSet() || data.size() > bufferSize) {
    setFlag = true;
    uint64_t newSize = data.size();
    newSize = std::max(newSize, 2 * bufferSize); // if we're expanding, at-least double
    glBufferData(getTarget(), newSize * sizeof(T), NULL, GL_STATIC_DRAW);
    bufferSize = newSize;
  }

  // do the actual copy
  dataSize = data.size();
  glBufferSubData(getTarget(), 0, dataSize * sizeof(T), &data[0]);

  checkGLError();
}